

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

boolean teleport_sink(void)

{
  bool bVar1;
  level *plVar2;
  level *plVar3;
  int x;
  int y;
  trap *ptVar4;
  long lVar5;
  long lVar6;
  trap *trp;
  rm *rndloc;
  rm *thisloc;
  int cnt;
  int cy;
  int cx;
  
  plVar2 = level;
  thisloc._0_4_ = 0;
  lVar5 = (long)u.ux;
  lVar6 = (long)u.uy;
  do {
    x = rnd(0x4f);
    y = rn2(0x15);
    plVar3 = level;
    ptVar4 = t_at(level,x,y);
    if (((plVar3->locations[x][y].typ != '\x19') || (ptVar4 != (trap *)0x0)) ||
       (bVar1 = false, (viz_array[y][x] & 2U) != 0)) {
      bVar1 = (int)thisloc < 200;
      thisloc._0_4_ = (int)thisloc + 1;
    }
  } while (bVar1);
  if ((plVar3->locations[x][y].typ == '\x19') && (ptVar4 == (trap *)0x0)) {
    plVar3->locations[x][y].typ = '\x1f';
    *(uint *)&plVar3->locations[x][y].field_0x6 =
         *(uint *)&plVar3->locations[x][y].field_0x6 & 0xfffffe0f |
         (*(uint *)&plVar2->locations[lVar5][lVar6].field_0x6 >> 4 & 0x1f) << 4;
    newsym(x,y);
    plVar2->locations[lVar5][lVar6].typ = '\x19';
    *(uint *)&plVar2->locations[lVar5][lVar6].field_0x6 =
         *(uint *)&plVar2->locations[lVar5][lVar6].field_0x6 & 0xfffffe0f;
    newsym((int)u.ux,(int)u.uy);
    cy._3_1_ = '\x01';
  }
  else {
    cy._3_1_ = '\0';
  }
  return cy._3_1_;
}

Assistant:

static boolean teleport_sink(void)
{
	int cx, cy;
	int cnt = 0;
	struct rm *thisloc, *rndloc;
	struct trap *trp;

	thisloc = &level->locations[u.ux][u.uy];
	do {
	    cx = rnd(COLNO - 1);
	    cy = rn2(ROWNO);
	    rndloc = &level->locations[cx][cy];
	    trp = t_at(level, cx, cy);
	} while ((rndloc->typ != ROOM || trp || cansee(cx, cy)) && cnt++ < 200);

	if (rndloc->typ == ROOM && !trp) {
	    /* create sink at new position */
	    rndloc->typ = SINK;
	    rndloc->looted = thisloc->looted;
	    newsym(cx, cy);
	    /* remove old sink */
	    thisloc->typ = ROOM;
	    thisloc->looted = 0;
	    newsym(u.ux, u.uy);
	    return TRUE;
	}

	return FALSE;
}